

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void lsvm::object::free_package(package *pkg)

{
  entry *e;
  iterator it;
  iterator *in_stack_ffffffffffffffc8;
  hashmap *in_stack_ffffffffffffffd0;
  
  hashmap::get_iterator(in_stack_ffffffffffffffd0);
  while( true ) {
    in_stack_ffffffffffffffc8 = (iterator *)hashmap::next(in_stack_ffffffffffffffc8);
    if (in_stack_ffffffffffffffc8 == (iterator *)0x0) break;
    free_class((object_class *)0x10a09d);
  }
  symbol::free_symbolmap((symbolmap *)0x10a0ad);
  memory::retain(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void free_package(package* pkg){
    lsvm::hashmap::iterator it = lsvm::hashmap::get_iterator(pkg->classes);
    lsvm::hashmap::entry* e;
    while((e = lsvm::hashmap::next(&it)) != null){
        lsvm::object::free_class((object_class*)e->val);    
    }
    lsvm::symbol::free_symbolmap(pkg->classes);
    lsvm::memory::retain(pkg);
}